

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void act_clause2_rescale(sat_solver2 *s)

{
  int iVar1;
  int *piVar2;
  uint *act_clas;
  int i;
  sat_solver2 *s_local;
  
  piVar2 = veci_begin(&s->act_clas);
  act_clas._4_4_ = 0;
  while( true ) {
    iVar1 = veci_size(&s->act_clas);
    if (iVar1 <= act_clas._4_4_) break;
    piVar2[act_clas._4_4_] = (uint)piVar2[act_clas._4_4_] >> 0xe;
    act_clas._4_4_ = act_clas._4_4_ + 1;
  }
  s->cla_inc = s->cla_inc >> 0xe;
  iVar1 = Abc_MaxInt(s->cla_inc,0x400);
  s->cla_inc = iVar1;
  return;
}

Assistant:

static inline void act_clause2_rescale(sat_solver2* s) {
//    static abctime Total = 0;
//    abctime clk = Abc_Clock();
    int i;
    unsigned * act_clas = (unsigned *)veci_begin(&s->act_clas);
    for (i = 0; i < veci_size(&s->act_clas); i++)
        act_clas[i] >>= 14;
    s->cla_inc >>= 14;
    s->cla_inc = Abc_MaxInt( s->cla_inc, (1<<10) );
//    Total += Abc_Clock() - clk;
//    Abc_Print(1, "Rescaling...   Cla inc = %5d  Conf = %10d   ", s->cla_inc,  s->stats.conflicts );
//    Abc_PrintTime( 1, "Time", Total );
}